

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  void *pvVar1;
  ZSTD_freeFunction p_Var2;
  ZSTD_customMem customMem;
  size_t sVar3;
  
  if (dctx != (ZSTD_DCtx *)0x0) {
    if (dctx->staticSize == 0) {
      pvVar1 = (dctx->customMem).opaque;
      p_Var2 = (dctx->customMem).customFree;
      customMem = dctx->customMem;
      ZSTD_clearDict(dctx);
      ZSTD_free(dctx->inBuff,customMem);
      dctx->inBuff = (char *)0x0;
      if (p_Var2 == (ZSTD_freeFunction)0x0) {
        free(dctx);
      }
      else {
        (*p_Var2)(pvVar1,dctx);
      }
      sVar3 = 0;
    }
    else {
      sVar3 = 0xffffffffffffffc0;
    }
    return sVar3;
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_free(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        ZSTD_free(dctx, cMem);
        return 0;
    }
}